

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttp2protocolhandler_p.cpp
# Opt level: O3

void * __thiscall QHttp2ProtocolHandler::qt_metacast(QHttp2ProtocolHandler *this,char *_clname)

{
  int iVar1;
  void *pvVar2;
  
  if (_clname == (char *)0x0) {
    this = (QHttp2ProtocolHandler *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN21QHttp2ProtocolHandlerE_t>
                           .strings);
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"QAbstractProtocolHandler");
      if (iVar1 != 0) {
        pvVar2 = (void *)QObject::qt_metacast((char *)this);
        return pvVar2;
      }
      this = this + 0x10;
    }
  }
  return this;
}

Assistant:

void *QHttp2ProtocolHandler::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_ZN21QHttp2ProtocolHandlerE_t>.strings))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "QAbstractProtocolHandler"))
        return static_cast< QAbstractProtocolHandler*>(this);
    return QObject::qt_metacast(_clname);
}